

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::translateInternal
          (StructTranslator *this,MemberInfo *root,Builder builder)

{
  Which WVar1;
  MemberInfo *pMVar2;
  ErrorReporter *pEVar3;
  MemberInfo **ppMVar4;
  AuxNode *pAVar5;
  Reader ordinal;
  Reader type;
  Builder target;
  Builder target_00;
  Reader type_00;
  Builder target_01;
  StructReader source;
  _Rb_tree_color _Var6;
  bool bVar7;
  undefined4 uVar8;
  StructReader *pSVar9;
  _Base_ptr p_Var10;
  AuxNode *group;
  MemberInfo **ppMVar11;
  AuxNode *builder_00;
  char *pcVar12;
  NodeTranslator *pNVar13;
  NodeTranslator *this_00;
  StringPtr message;
  StringPtr message_00;
  StringPtr targetsFlagName;
  undefined8 uStackY_450;
  Builder typeBuilder;
  anon_class_8_1_60e67bd8 _kjContextFunc1389;
  ArrayPtr<const_char> local_360;
  Fault f;
  ArrayPtr<const_char> local_320;
  Builder slot;
  Maybe<capnp::Schema> local_2b8;
  Builder local_2a8;
  undefined1 local_280 [40];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_node_translator_c__:1389:7)>
  _kjContext1389;
  AuxNode *local_208;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_200;
  AuxNode *local_1f8;
  ArrayDisposer *pAStack_1f0;
  AuxNode *local_1e8;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_1e0;
  AuxNode *local_1d8;
  ArrayDisposer *pAStack_1d0;
  UnfinishedValue *local_1c8;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRStack_1c0;
  UnfinishedValue *local_1b8;
  ArrayDisposer *pAStack_1b0;
  Reader local_1a8;
  Builder fieldBuilder;
  Builder structBuilder;
  StructReader local_128;
  StructReader local_f8;
  DuplicateOrdinalDetector dupDetector;
  undefined1 local_80 [80];
  
  capnp::schema::Node::Builder::initStruct(&structBuilder,&builder);
  dupDetector.errorReporter = this->errorReporter;
  dupDetector.expectedOrdinal = 0;
  dupDetector.lastOrdinalLocation.ptr.isSet = false;
  p_Var10 = (this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var10 == &(this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header)
    {
      MemberInfo::finishGroup(root);
      ppMVar11 = (this->allMembers).builder.ptr;
      ppMVar4 = (this->allMembers).builder.pos;
      do {
        if (ppMVar11 == ppMVar4) {
          *(short *)((long)structBuilder._builder.data + 0xe) =
               (short)(this->layout).top.dataWordCount;
          *(short *)((long)structBuilder._builder.data + 0x18) =
               (short)(this->layout).top.pointerCount;
          *(undefined2 *)((long)structBuilder._builder.data + 0x1a) = 7;
          pAVar5 = (this->translator->groups).builder.pos;
          for (builder_00 = (this->translator->groups).builder.ptr; builder_00 != pAVar5;
              builder_00 = builder_00 + 1) {
            capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
                      ((Builder *)&_kjContext1389,(OrphanBuilder *)builder_00);
            *(undefined2 *)(_kjContext1389.super_Context._16_8_ + 0xe) =
                 *(undefined2 *)((long)structBuilder._builder.data + 0xe);
            *(undefined4 *)(_kjContext1389.super_Context._16_8_ + 0x18) =
                 *(undefined4 *)((long)structBuilder._builder.data + 0x18);
          }
          return;
        }
        pMVar2 = *ppMVar11;
        pcVar12 = "targetsParam";
        if (pMVar2->isParam == false) {
          WVar1 = pMVar2->declKind;
          pcVar12 = "targetsField";
          if (WVar1 != FIELD) {
            pcVar12 = "targetsUnion";
            if (WVar1 != UNION) {
              if (WVar1 != GROUP) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                          ((Fault *)&_kjContext1389,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                           ,0x5e9,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                           (char (*) [24])"Unexpected member type.");
                kj::_::Debug::Fault::fatal((Fault *)&_kjContext1389);
              }
              pcVar12 = "targetsGroup";
            }
            MemberInfo::finishGroup(pMVar2);
          }
        }
        MemberInfo::getSchema((Builder *)&_kjContext1389,pMVar2);
        targetsFlagName.content.size_ = 0xd;
        targetsFlagName.content.ptr = pcVar12;
        compileAnnotationApplications
                  ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&f,
                   this->translator,(Reader)(pMVar2->declAnnotations).reader,targetsFlagName);
        capnp::schema::Field::Builder::adoptAnnotations
                  ((Builder *)&_kjContext1389,
                   (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&f);
        capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&f);
        ppMVar11 = ppMVar11 + 1;
      } while( true );
    }
    pMVar2 = (MemberInfo *)p_Var10[1]._M_parent;
    _kjContextFunc1389.member = pMVar2;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++:1389:7)>
    ::ContextImpl(&_kjContext1389,&_kjContextFunc1389);
    if ((0xf < (pMVar2->declId)._reader.dataSize) && (*(pMVar2->declId)._reader.data == 2)) {
      Declaration::Id::Reader::getOrdinal(&local_1a8,&pMVar2->declId);
      ordinal._reader.capTable = local_1a8._reader.capTable;
      ordinal._reader.segment = local_1a8._reader.segment;
      ordinal._reader.data = local_1a8._reader.data;
      ordinal._reader.pointers = local_1a8._reader.pointers;
      ordinal._reader.dataSize = local_1a8._reader.dataSize;
      ordinal._reader.pointerCount = local_1a8._reader.pointerCount;
      ordinal._reader._38_2_ = local_1a8._reader._38_2_;
      ordinal._reader.nestingLimit = local_1a8._reader.nestingLimit;
      ordinal._reader._44_4_ = local_1a8._reader._44_4_;
      DuplicateOrdinalDetector::check(&dupDetector,ordinal);
    }
    MemberInfo::getSchema(&fieldBuilder,pMVar2);
    _Var6 = p_Var10[1]._M_color;
    *(undefined2 *)((long)fieldBuilder._builder.data + 10) = 1;
    *(short *)((long)fieldBuilder._builder.data + 0xc) = (short)_Var6;
    WVar1 = pMVar2->declKind;
    if (WVar1 != FIELD) {
      if (WVar1 != UNION) {
        if (WVar1 != GROUP) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x5cc,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                     (char (*) [24])"Unexpected member type.");
          kj::_::Debug::Fault::fatal(&f);
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x5c8,FAILED,(char *)0x0,"\"Groups don\'t have ordinals.\"",
                   (char (*) [28])"Groups don\'t have ordinals.");
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar7 = StructLayout::Union::addDiscriminant((pMVar2->field_21).unionScope);
      if (!bVar7) {
        pEVar3 = this->errorReporter;
        Declaration::Id::Reader::getOrdinal((Reader *)&f,&pMVar2->declId);
        message.content.size_ = 0x96;
        message.content.ptr =
             "Union ordinal, if specified, must be greater than no more than one of its member ordinals (i.e. there can only be one field retroactively unionized)."
        ;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader>
                  (pEVar3,(Reader *)&f,message);
      }
      goto LAB_0034d946;
    }
    capnp::schema::Field::Builder::initSlot(&slot,&fieldBuilder);
    capnp::schema::Field::Slot::Builder::initType(&typeBuilder,&slot);
    target._builder.capTable = typeBuilder._builder.capTable;
    target._builder.segment = typeBuilder._builder.segment;
    target._builder.data = typeBuilder._builder.data;
    target._builder.pointers = typeBuilder._builder.pointers;
    target._builder.dataSize = typeBuilder._builder.dataSize;
    target._builder.pointerCount = typeBuilder._builder.pointerCount;
    target._builder._38_2_ = typeBuilder._builder._38_2_;
    bVar7 = compileType(this->translator,(Reader)(pMVar2->fieldType)._reader,target,
                        this->implicitMethodParams);
    if (bVar7) {
      if (pMVar2->hasDefaultValue != true) {
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        pNVar13 = (NodeTranslator *)(local_80 + 0x28);
        this_00 = pNVar13;
        capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar13,&slot);
        pSVar9 = &local_f8;
        goto LAB_0034d7b0;
      }
      if (((pMVar2->isParam == true) && (0xf < (pMVar2->fieldDefaultValue)._reader.dataSize)) &&
         (*(pMVar2->fieldDefaultValue)._reader.data == 5)) {
        Expression::Reader::getRelativeName((Reader *)&f,&pMVar2->fieldDefaultValue);
        local_320 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f);
        local_360.ptr = "null";
        local_360.size_ = 5;
        bVar7 = kj::ArrayPtr<const_char>::operator==(&local_320,&local_360);
        if (!bVar7) goto LAB_0034d7ef;
        if ((0x12 < *typeBuilder._builder.data) ||
           ((0x77000U >> (*typeBuilder._builder.data & 0x1f) & 1) == 0)) {
          pEVar3 = this->errorReporter;
          Expression::Reader::getRelativeName((Reader *)&f,&pMVar2->fieldDefaultValue);
          message_00.content.size_ = 0x3d;
          message_00.content.ptr = "Only pointer parameters can declare their default as \'null\'.";
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (pEVar3,(Reader *)&f,message_00);
        }
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        pNVar13 = (NodeTranslator *)local_280;
        capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar13,&slot);
        type._reader.capTable = (CapTableReader *)pAStack_1d0;
        type._reader.segment = (SegmentReader *)local_1d8;
        type._reader.data = local_1c8;
        type._reader.pointers = (WirePointer *)pRStack_1c0;
        type._reader._32_8_ = local_1b8;
        type._reader._40_8_ = pAStack_1b0;
        target_00._builder.capTable = (CapTableBuilder *)local_280._8_8_;
        target_00._builder.segment = (SegmentBuilder *)local_280._0_8_;
        target_00._builder.data = (void *)local_280._16_8_;
        target_00._builder.pointers = (WirePointer *)local_280._24_8_;
        target_00._builder.dataSize = local_280._32_4_;
        target_00._builder.pointerCount = local_280._36_2_;
        target_00._builder._38_2_ = local_280._38_2_;
        compileDefaultDefaultValue(pNVar13,type,target_00);
      }
      else {
LAB_0034d7ef:
        pNVar13 = this->translator;
        source = (pMVar2->fieldDefaultValue)._reader;
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        capnp::schema::Field::Slot::Builder::initDefaultValue(&local_2a8,&slot);
        local_2b8.ptr.isSet = false;
        type_00._reader.capTable = (CapTableReader *)pRStack_200;
        type_00._reader.segment = (SegmentReader *)local_208;
        type_00._reader.data = local_1f8;
        type_00._reader.pointers = (WirePointer *)pAStack_1f0;
        type_00._reader._32_8_ = local_1e8;
        type_00._reader._40_8_ = pRStack_1e0;
        target_01._builder.capTable = local_2a8._builder.capTable;
        target_01._builder.segment = local_2a8._builder.segment;
        target_01._builder.data = local_2a8._builder.data;
        target_01._builder.pointers = local_2a8._builder.pointers;
        target_01._builder.dataSize = local_2a8._builder.dataSize;
        target_01._builder.pointerCount = local_2a8._builder.pointerCount;
        target_01._builder._38_2_ = local_2a8._builder._38_2_;
        compileBootstrapValue(pNVar13,(Reader)source,type_00,target_01,&local_2b8);
      }
      *(byte *)((long)slot._builder.data + 0x10) = *(byte *)((long)slot._builder.data + 0x10) | 1;
    }
    else {
      capnp::_::StructBuilder::asReader(&typeBuilder._builder);
      pNVar13 = (NodeTranslator *)local_80;
      this_00 = pNVar13;
      capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar13,&slot);
      pSVar9 = &local_128;
LAB_0034d7b0:
      compileDefaultDefaultValue(this_00,(Reader)*pSVar9,(Builder)*(StructBuilder *)pNVar13);
    }
    switch(*typeBuilder._builder.data) {
    case 1:
      uStackY_450 = 0;
      break;
    case 2:
    case 6:
      uStackY_450 = 3;
      break;
    case 3:
    case 7:
    case 0xf:
      uStackY_450 = 4;
      break;
    case 4:
    case 8:
    case 10:
      uStackY_450 = 5;
      break;
    case 5:
    case 9:
    case 0xb:
      uStackY_450 = 6;
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x12:
      uVar8 = (*(code *)((pMVar2->field_21).unionScope)->parent[2]._vptr_StructOrGroup)();
      goto LAB_0034d93b;
    default:
      uVar8 = 0;
      (*(code *)((pMVar2->field_21).unionScope)->parent->_vptr_StructOrGroup)();
      goto LAB_0034d93b;
    }
    uVar8 = (*(code *)((pMVar2->field_21).unionScope)->parent[1]._vptr_StructOrGroup)
                      ((pMVar2->field_21).unionScope,uStackY_450);
LAB_0034d93b:
    *(undefined4 *)((long)slot._builder.data + 4) = uVar8;
LAB_0034d946:
    kj::_::Debug::Context::~Context(&_kjContext1389.super_Context);
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void translateInternal(MemberInfo& root, schema::Node::Builder builder) {
    auto structBuilder = builder.initStruct();

    // Go through each member in ordinal order, building each member schema.
    DuplicateOrdinalDetector dupDetector(errorReporter);
    for (auto& entry: membersByOrdinal) {
      MemberInfo& member = *entry.second;

      // Make sure the exceptions added relating to
      // https://github.com/capnproto/capnproto/issues/344 identify the affected field.
      KJ_CONTEXT(member.name);

      if (member.declId.isOrdinal()) {
        dupDetector.check(member.declId.getOrdinal());
      }

      schema::Field::Builder fieldBuilder = member.getSchema();
      fieldBuilder.getOrdinal().setExplicit(entry.first);

      switch (member.declKind) {
        case Declaration::FIELD: {
          auto slot = fieldBuilder.initSlot();
          auto typeBuilder = slot.initType();
          if (translator.compileType(member.fieldType, typeBuilder, implicitMethodParams)) {
            if (member.hasDefaultValue) {
              if (member.isParam &&
                  member.fieldDefaultValue.isRelativeName() &&
                  member.fieldDefaultValue.getRelativeName().getValue() == "null") {
                // special case: parameter set null
                switch (typeBuilder.which()) {
                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::LIST:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::ANY_POINTER:
                    break;
                  default:
                    errorReporter.addErrorOn(member.fieldDefaultValue.getRelativeName(),
                        "Only pointer parameters can declare their default as 'null'.");
                    break;
                }
                translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
              } else {
                translator.compileBootstrapValue(member.fieldDefaultValue,
                                                 typeBuilder, slot.initDefaultValue());
              }
              slot.setHadExplicitDefault(true);
            } else {
              translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
            }
          } else {
            translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
          }

          int lgSize = -1;
          switch (typeBuilder.which()) {
            case schema::Type::VOID: lgSize = -1; break;
            case schema::Type::BOOL: lgSize = 0; break;
            case schema::Type::INT8: lgSize = 3; break;
            case schema::Type::INT16: lgSize = 4; break;
            case schema::Type::INT32: lgSize = 5; break;
            case schema::Type::INT64: lgSize = 6; break;
            case schema::Type::UINT8: lgSize = 3; break;
            case schema::Type::UINT16: lgSize = 4; break;
            case schema::Type::UINT32: lgSize = 5; break;
            case schema::Type::UINT64: lgSize = 6; break;
            case schema::Type::FLOAT32: lgSize = 5; break;
            case schema::Type::FLOAT64: lgSize = 6; break;

            case schema::Type::TEXT: lgSize = -2; break;
            case schema::Type::DATA: lgSize = -2; break;
            case schema::Type::LIST: lgSize = -2; break;
            case schema::Type::ENUM: lgSize = 4; break;
            case schema::Type::STRUCT: lgSize = -2; break;
            case schema::Type::INTERFACE: lgSize = -2; break;
            case schema::Type::ANY_POINTER: lgSize = -2; break;
          }

          if (lgSize == -2) {
            // pointer
            slot.setOffset(member.fieldScope->addPointer());
          } else if (lgSize == -1) {
            // void
            member.fieldScope->addVoid();
            slot.setOffset(0);
          } else {
            slot.setOffset(member.fieldScope->addData(lgSize));
          }
          break;
        }

        case Declaration::UNION:
          if (!member.unionScope->addDiscriminant()) {
            errorReporter.addErrorOn(member.declId.getOrdinal(),
                "Union ordinal, if specified, must be greater than no more than one of its "
                "member ordinals (i.e. there can only be one field retroactively unionized).");
          }
          break;

        case Declaration::GROUP:
          KJ_FAIL_ASSERT("Groups don't have ordinals.");
          break;

        default:
          KJ_FAIL_ASSERT("Unexpected member type.");
          break;
      }
    }

    // OK, we should have built all the members.  Now go through and make sure the discriminant
    // offsets have been copied over to the schemas and annotations have been applied.
    root.finishGroup();
    for (auto member: allMembers) {
      kj::StringPtr targetsFlagName;
      if (member->isParam) {
        targetsFlagName = "targetsParam";
      } else {
        switch (member->declKind) {
          case Declaration::FIELD:
            targetsFlagName = "targetsField";
            break;

          case Declaration::UNION:
            member->finishGroup();
            targetsFlagName = "targetsUnion";
            break;

          case Declaration::GROUP:
            member->finishGroup();
            targetsFlagName = "targetsGroup";
            break;

          default:
            KJ_FAIL_ASSERT("Unexpected member type.");
            break;
        }
      }

      member->getSchema().adoptAnnotations(translator.compileAnnotationApplications(
          member->declAnnotations, targetsFlagName));
    }

    // And fill in the sizes.
    structBuilder.setDataWordCount(layout.getTop().dataWordCount);
    structBuilder.setPointerCount(layout.getTop().pointerCount);
    structBuilder.setPreferredListEncoding(schema::ElementSize::INLINE_COMPOSITE);

    for (auto& group: translator.groups) {
      auto groupBuilder = group.node.get().getStruct();
      groupBuilder.setDataWordCount(structBuilder.getDataWordCount());
      groupBuilder.setPointerCount(structBuilder.getPointerCount());
      groupBuilder.setPreferredListEncoding(structBuilder.getPreferredListEncoding());
    }
  }